

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void __thiscall
duckdb::Executor::ScheduleEvents
          (Executor *this,
          vector<duckdb::shared_ptr<duckdb::MetaPipeline,_true>,_true> *meta_pipelines)

{
  ScheduleEventData event_data;
  ScheduleEventData local_60;
  
  local_60.events = &this->events;
  local_60.initial_schedule = true;
  local_60.event_map._M_h._M_buckets = &local_60.event_map._M_h._M_single_bucket;
  local_60.event_map._M_h._M_bucket_count = 1;
  local_60.event_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60.event_map._M_h._M_element_count = 0;
  local_60.event_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_60.event_map._M_h._M_rehash_policy._M_next_resize = 0;
  local_60.event_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_60.meta_pipelines = meta_pipelines;
  ScheduleEventsInternal((Executor *)local_60.events,&local_60);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::Pipeline>,_std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::PipelineEventStack>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::PipelineEventStack>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::Pipeline>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60.event_map._M_h);
  return;
}

Assistant:

void Executor::ScheduleEvents(const vector<shared_ptr<MetaPipeline>> &meta_pipelines) {
	ScheduleEventData event_data(meta_pipelines, events, true);
	ScheduleEventsInternal(event_data);
}